

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O0

void ExtractAnimationData
               (Asset *mAsset,string *animId,Ref<glTF::Animation> *animRef,Ref<glTF::Buffer> *buffer
               ,aiNodeAnim *nodeChannel,float ticksPerSecond)

{
  double dVar1;
  aiVectorKey *paVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  aiVectorKey *paVar6;
  float fVar7;
  bool bVar8;
  reference pvVar9;
  ulong uVar10;
  aiVector3t<float> *paVar11;
  aiVector3t<float> *paVar12;
  void *data;
  Animation *pAVar13;
  Ref<glTF::Accessor> RVar14;
  aiVector3t<float> *local_200;
  aiVector3t<float> *local_1d0;
  vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *local_158;
  Ref<glTF::Accessor> rotAccessor;
  size_t frameIndex_3;
  size_t i_4;
  vec4 *rotationData;
  vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *local_120;
  Ref<glTF::Accessor> scaleAccessor;
  size_t frameIndex_2;
  size_t i_3;
  aiVector3D *scaleData;
  vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *local_e8;
  Ref<glTF::Accessor> tranAccessor;
  size_t frameIndex_1;
  size_t i_2;
  aiVector3D *translationData;
  vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *local_b0;
  Ref<glTF::Accessor> timeAccessor;
  size_t frameIndex;
  size_t i_1;
  undefined1 local_80 [8];
  vector<float,_std::allocator<float>_> timeData;
  uint uStack_60;
  int i;
  size_t numKeyframes;
  size_t counts [3];
  float ticksPerSecond_local;
  aiNodeAnim *nodeChannel_local;
  Ref<glTF::Buffer> *buffer_local;
  Ref<glTF::Animation> *animRef_local;
  string *animId_local;
  Asset *mAsset_local;
  
  counts[0] = (ulong)nodeChannel->mNumScalingKeys;
  counts[1] = (ulong)nodeChannel->mNumRotationKeys;
  _uStack_60 = 1;
  for (timeData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_ = 0;
      timeData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ < 3;
      timeData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           timeData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    if (_uStack_60 <
        counts[(long)timeData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_ + -1]) {
      _uStack_60 = counts[(long)timeData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_ + -1];
    }
  }
  if (nodeChannel->mNumPositionKeys != 0) {
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_80);
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)local_80,_uStack_60);
    for (frameIndex = 0; frameIndex < _uStack_60; frameIndex = frameIndex + 1) {
      timeAccessor._8_8_ = (frameIndex * nodeChannel->mNumPositionKeys) / _uStack_60;
      dVar1 = nodeChannel->mPositionKeys[timeAccessor._8_8_].mTime;
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_80,frameIndex);
      *pvVar9 = (float)(dVar1 / (double)ticksPerSecond);
    }
    pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_80,0);
    RVar14 = ExportData(mAsset,animId,buffer,uStack_60,pvVar9,SCALAR,SCALAR,ComponentType_FLOAT,
                        false);
    local_b0 = RVar14.vector;
    timeAccessor.vector._0_4_ = RVar14.index;
    bVar8 = glTF::Ref::operator_cast_to_bool((Ref *)&local_b0);
    if (bVar8) {
      pAVar13 = glTF::Ref<glTF::Animation>::operator->(animRef);
      (pAVar13->Parameters).TIME.vector = local_b0;
      (pAVar13->Parameters).TIME.index = (uint)timeAccessor.vector;
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_80);
  }
  if (nodeChannel->mNumPositionKeys != 0) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = _uStack_60;
    uVar10 = SUB168(auVar3 * ZEXT816(0xc),0);
    if (SUB168(auVar3 * ZEXT816(0xc),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    paVar11 = (aiVector3t<float> *)operator_new__(uVar10);
    if (_uStack_60 != 0) {
      local_1d0 = paVar11;
      do {
        aiVector3t<float>::aiVector3t(local_1d0);
        local_1d0 = local_1d0 + 1;
      } while (local_1d0 != paVar11 + _uStack_60);
    }
    for (frameIndex_1 = 0; frameIndex_1 < _uStack_60; frameIndex_1 = frameIndex_1 + 1) {
      tranAccessor._8_8_ = (frameIndex_1 * nodeChannel->mNumPositionKeys) / _uStack_60;
      paVar2 = nodeChannel->mPositionKeys;
      paVar12 = paVar11 + frameIndex_1;
      paVar6 = paVar2 + tranAccessor._8_8_;
      fVar7 = (paVar6->mValue).y;
      paVar12->x = (paVar6->mValue).x;
      paVar12->y = fVar7;
      paVar12->z = paVar2[tranAccessor._8_8_].mValue.z;
    }
    RVar14 = ExportData(mAsset,animId,buffer,uStack_60,paVar11,VEC3,VEC3,ComponentType_FLOAT,false);
    local_e8 = RVar14.vector;
    tranAccessor.vector._0_4_ = RVar14.index;
    bVar8 = glTF::Ref::operator_cast_to_bool((Ref *)&local_e8);
    if (bVar8) {
      pAVar13 = glTF::Ref<glTF::Animation>::operator->(animRef);
      (pAVar13->Parameters).translation.vector = local_e8;
      (pAVar13->Parameters).translation.index = (uint)tranAccessor.vector;
    }
    if (paVar11 != (aiVector3t<float> *)0x0) {
      operator_delete__(paVar11);
    }
  }
  if (nodeChannel->mNumScalingKeys != 0) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = _uStack_60;
    uVar10 = SUB168(auVar4 * ZEXT816(0xc),0);
    if (SUB168(auVar4 * ZEXT816(0xc),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    paVar11 = (aiVector3t<float> *)operator_new__(uVar10);
    if (_uStack_60 != 0) {
      local_200 = paVar11;
      do {
        aiVector3t<float>::aiVector3t(local_200);
        local_200 = local_200 + 1;
      } while (local_200 != paVar11 + _uStack_60);
    }
    for (frameIndex_2 = 0; frameIndex_2 < _uStack_60; frameIndex_2 = frameIndex_2 + 1) {
      scaleAccessor._8_8_ = (frameIndex_2 * nodeChannel->mNumScalingKeys) / _uStack_60;
      paVar2 = nodeChannel->mScalingKeys;
      paVar12 = paVar11 + frameIndex_2;
      paVar6 = paVar2 + scaleAccessor._8_8_;
      fVar7 = (paVar6->mValue).y;
      paVar12->x = (paVar6->mValue).x;
      paVar12->y = fVar7;
      paVar12->z = paVar2[scaleAccessor._8_8_].mValue.z;
    }
    RVar14 = ExportData(mAsset,animId,buffer,uStack_60,paVar11,VEC3,VEC3,ComponentType_FLOAT,false);
    local_120 = RVar14.vector;
    scaleAccessor.vector._0_4_ = RVar14.index;
    bVar8 = glTF::Ref::operator_cast_to_bool((Ref *)&local_120);
    if (bVar8) {
      pAVar13 = glTF::Ref<glTF::Animation>::operator->(animRef);
      (pAVar13->Parameters).scale.vector = local_120;
      (pAVar13->Parameters).scale.index = (uint)scaleAccessor.vector;
    }
    if (paVar11 != (aiVector3t<float> *)0x0) {
      operator_delete__(paVar11);
    }
  }
  if (nodeChannel->mNumRotationKeys != 0) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = _uStack_60;
    uVar10 = SUB168(auVar5 * ZEXT816(0x10),0);
    if (SUB168(auVar5 * ZEXT816(0x10),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    data = operator_new__(uVar10);
    for (frameIndex_3 = 0; frameIndex_3 < _uStack_60; frameIndex_3 = frameIndex_3 + 1) {
      rotAccessor._8_8_ = (frameIndex_3 * nodeChannel->mNumRotationKeys) / _uStack_60;
      *(float *)((long)data + frameIndex_3 * 0x10) =
           nodeChannel->mRotationKeys[rotAccessor._8_8_].mValue.x;
      *(float *)((long)data + frameIndex_3 * 0x10 + 4) =
           nodeChannel->mRotationKeys[rotAccessor._8_8_].mValue.y;
      *(float *)((long)data + frameIndex_3 * 0x10 + 8) =
           nodeChannel->mRotationKeys[rotAccessor._8_8_].mValue.z;
      *(float *)((long)data + frameIndex_3 * 0x10 + 0xc) =
           nodeChannel->mRotationKeys[rotAccessor._8_8_].mValue.w;
    }
    RVar14 = ExportData(mAsset,animId,buffer,uStack_60,data,VEC4,VEC4,ComponentType_FLOAT,false);
    local_158 = RVar14.vector;
    rotAccessor.vector._0_4_ = RVar14.index;
    bVar8 = glTF::Ref::operator_cast_to_bool((Ref *)&local_158);
    if (bVar8) {
      pAVar13 = glTF::Ref<glTF::Animation>::operator->(animRef);
      (pAVar13->Parameters).rotation.vector = local_158;
      (pAVar13->Parameters).rotation.index = (uint)rotAccessor.vector;
    }
    if (data != (void *)0x0) {
      operator_delete__(data);
    }
  }
  return;
}

Assistant:

inline void ExtractAnimationData(Asset& mAsset, std::string& animId, Ref<Animation>& animRef, Ref<Buffer>& buffer, const aiNodeAnim* nodeChannel, float ticksPerSecond)
{
    // Loop over the data and check to see if it exactly matches an existing buffer.
    //    If yes, then reference the existing corresponding accessor.
    //    Otherwise, add to the buffer and create a new accessor.

    size_t counts[3] = {
        nodeChannel->mNumPositionKeys,
        nodeChannel->mNumScalingKeys,
        nodeChannel->mNumRotationKeys,
    };
    size_t numKeyframes = 1;
    for (int i = 0; i < 3; ++i) {
        if (counts[i] > numKeyframes) {
            numKeyframes = counts[i];
        }
    }

    //-------------------------------------------------------
    // Extract TIME parameter data.
    // Check if the timeStamps are the same for mPositionKeys, mRotationKeys, and mScalingKeys.
    if(nodeChannel->mNumPositionKeys > 0) {
        typedef float TimeType;
        std::vector<TimeType> timeData;
        timeData.resize(numKeyframes);
        for (size_t i = 0; i < numKeyframes; ++i) {
            size_t frameIndex = i * nodeChannel->mNumPositionKeys / numKeyframes;
            // mTime is measured in ticks, but GLTF time is measured in seconds, so convert.
            // Check if we have to cast type here. e.g. uint16_t()
            timeData[i] = static_cast<float>(nodeChannel->mPositionKeys[frameIndex].mTime / ticksPerSecond);
        }

        Ref<Accessor> timeAccessor = ExportData(mAsset, animId, buffer, static_cast<unsigned int>(numKeyframes), &timeData[0], AttribType::SCALAR, AttribType::SCALAR, ComponentType_FLOAT);
        if (timeAccessor) animRef->Parameters.TIME = timeAccessor;
    }

    //-------------------------------------------------------
    // Extract translation parameter data
    if(nodeChannel->mNumPositionKeys > 0) {
        C_STRUCT aiVector3D* translationData = new aiVector3D[numKeyframes];
        for (size_t i = 0; i < numKeyframes; ++i) {
            size_t frameIndex = i * nodeChannel->mNumPositionKeys / numKeyframes;
            translationData[i] = nodeChannel->mPositionKeys[frameIndex].mValue;
        }

        Ref<Accessor> tranAccessor = ExportData(mAsset, animId, buffer, static_cast<unsigned int>(numKeyframes), translationData, AttribType::VEC3, AttribType::VEC3, ComponentType_FLOAT);
        if ( tranAccessor ) {
            animRef->Parameters.translation = tranAccessor;
        }
        delete[] translationData;
    }

    //-------------------------------------------------------
    // Extract scale parameter data
    if(nodeChannel->mNumScalingKeys > 0) {
        C_STRUCT aiVector3D* scaleData = new aiVector3D[numKeyframes];
        for (size_t i = 0; i < numKeyframes; ++i) {
            size_t frameIndex = i * nodeChannel->mNumScalingKeys / numKeyframes;
            scaleData[i] = nodeChannel->mScalingKeys[frameIndex].mValue;
        }

        Ref<Accessor> scaleAccessor = ExportData(mAsset, animId, buffer, static_cast<unsigned int>(numKeyframes), scaleData, AttribType::VEC3, AttribType::VEC3, ComponentType_FLOAT);
        if ( scaleAccessor ) {
            animRef->Parameters.scale = scaleAccessor;
        }
        delete[] scaleData;
    }

    //-------------------------------------------------------
    // Extract rotation parameter data
    if(nodeChannel->mNumRotationKeys > 0) {
        vec4* rotationData = new vec4[numKeyframes];
        for (size_t i = 0; i < numKeyframes; ++i) {
            size_t frameIndex = i * nodeChannel->mNumRotationKeys / numKeyframes;
            rotationData[i][0] = nodeChannel->mRotationKeys[frameIndex].mValue.x;
            rotationData[i][1] = nodeChannel->mRotationKeys[frameIndex].mValue.y;
            rotationData[i][2] = nodeChannel->mRotationKeys[frameIndex].mValue.z;
            rotationData[i][3] = nodeChannel->mRotationKeys[frameIndex].mValue.w;
        }

        Ref<Accessor> rotAccessor = ExportData(mAsset, animId, buffer, static_cast<unsigned int>(numKeyframes), rotationData, AttribType::VEC4, AttribType::VEC4, ComponentType_FLOAT);
        if ( rotAccessor ) {
            animRef->Parameters.rotation = rotAccessor;
        }
        delete[] rotationData;
    }
}